

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall rlottie::internal::renderer::SolidLayer::updateContent(SolidLayer *this)

{
  Int IVar1;
  int iVar2;
  Layer *in_RDI;
  Color CVar3;
  VBrush brush;
  Color color;
  VMatrix *in_stack_ffffffffffffff48;
  Layer *this_00;
  VColor local_94;
  VBrush local_90;
  Color local_80;
  undefined8 local_6c;
  float local_64;
  Int local_60;
  Int local_5c [11];
  VSize local_30;
  VSize local_28;
  VRectF local_20;
  Int local_10;
  Int local_c [3];
  
  local_10 = (Int)Layer::flag((Layer *)in_RDI);
  local_c[0] = (Int)vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator&
                              ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)
                               in_stack_ffffffffffffff48,None);
  IVar1 = vFlag::operator_cast_to_unsigned_int((vFlag *)local_c);
  if (IVar1 != 0) {
    VPath::reset((VPath *)0x160d98);
    this_00 = (Layer *)&in_RDI[1].mLayerSize.mh;
    local_28 = internal::model::Layer::layerSize
                         ((Layer *)(in_RDI->super_Group).mChildren.
                                   super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    iVar2 = VSize::width(&local_28);
    in_stack_ffffffffffffff48 = (VMatrix *)(double)iVar2;
    local_30 = internal::model::Layer::layerSize
                         ((Layer *)(in_RDI->super_Group).mChildren.
                                   super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    iVar2 = VSize::height(&local_30);
    VRectF::VRectF(&local_20,0.0,0.0,(double)in_stack_ffffffffffffff48,(double)iVar2);
    VPath::addRect((VPath *)this_00,(VRectF *)in_stack_ffffffffffffff48,CCW);
    Layer::combinedMatrix(this_00);
    VPath::transform((VPath *)this_00,in_stack_ffffffffffffff48);
    vFlag<VDrawable::DirtyState>::operator|=
              ((vFlag<VDrawable::DirtyState> *)&in_RDI[1].super_Group.mTransform,Path);
    VPath::operator=((VPath *)this_00,(VPath *)in_stack_ffffffffffffff48);
  }
  local_60 = (Int)Layer::flag((Layer *)in_RDI);
  local_5c[0] = (Int)vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator&
                               ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)
                                in_stack_ffffffffffffff48,None);
  IVar1 = vFlag::operator_cast_to_unsigned_int((vFlag *)local_5c);
  if (IVar1 != 0) {
    CVar3 = internal::model::Layer::solidColor(in_RDI);
    local_80._0_8_ = CVar3._0_8_;
    local_6c._0_4_ = local_80.r;
    local_6c._4_4_ = local_80.g;
    local_80.b = CVar3.b;
    local_64 = local_80.b;
    local_80 = CVar3;
    Layer::combinedAlpha((Layer *)in_RDI);
    local_94 = internal::model::Color::toColor((Color *)in_stack_ffffffffffffff48,0.0);
    VBrush::VBrush(&local_90,&local_94);
    VDrawable::setBrush((VDrawable *)&in_RDI->mExtra,&local_90);
    vFlag<VDrawable::DirtyState>::operator|=
              ((vFlag<VDrawable::DirtyState> *)&in_RDI[1].super_Group.mTransform,Brush);
  }
  return;
}

Assistant:

void renderer::SolidLayer::updateContent()
{
    if (flag() & DirtyFlagBit::Matrix) {
        mPath.reset();
        mPath.addRect(VRectF(0, 0, mLayerData->layerSize().width(),
                            mLayerData->layerSize().height()));
        mPath.transform(combinedMatrix());
        mRenderNode.mFlag |= VDrawable::DirtyState::Path;
        mRenderNode.mPath = mPath;
    }
    if (flag() & DirtyFlagBit::Alpha) {
        model::Color color = mLayerData->solidColor();
        VBrush       brush(color.toColor(combinedAlpha()));
        mRenderNode.setBrush(brush);
        mRenderNode.mFlag |= VDrawable::DirtyState::Brush;
    }
}